

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_read_pcm_frames_within_range
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ma_result mVar4;
  long lVar5;
  ma_result mVar6;
  ulong uVar7;
  ulong uVar8;
  ma_data_source_base *pDataSourceBase;
  bool bVar9;
  ma_uint64 framesRead;
  ma_uint64 local_38;
  ulong local_30;
  
  local_38 = 0;
  if (pDataSource == (ma_data_source *)0x0) {
    return MA_AT_END;
  }
  bVar9 = *(int *)((long)pDataSource + 0x40) != 0;
  if (frameCount == 0) {
    return MA_INVALID_ARGS;
  }
  if (((*(byte *)(*pDataSource + 0x30) & 1) == 0) &&
     ((*(long *)((long)pDataSource + 0x10) != -1 ||
      (*(long *)((long)pDataSource + 0x20) != -1 && bVar9)))) {
    pcVar1 = *(code **)(*pDataSource + 0x18);
    if ((pcVar1 == (code *)0x0) || (iVar3 = (*pcVar1)(pDataSource,&local_30), iVar3 != 0)) {
      lVar5 = 0;
      bVar2 = false;
    }
    else {
      lVar5 = 0;
      if (*(ulong *)((long)pDataSource + 8) <= local_30) {
        lVar5 = local_30 - *(ulong *)((long)pDataSource + 8);
      }
      bVar2 = true;
    }
    if (bVar2) {
      uVar7 = *(ulong *)((long)pDataSource + 0x10);
      if (((bVar9) && (*(long *)((long)pDataSource + 0x20) != -1)) &&
         (uVar8 = *(long *)((long)pDataSource + 0x20) + *(long *)((long)pDataSource + 8),
         uVar8 <= uVar7)) {
        uVar7 = uVar8;
      }
      uVar8 = uVar7 - (*(long *)((long)pDataSource + 8) + lVar5);
      if (frameCount <= uVar8) {
        uVar8 = frameCount;
      }
      if (uVar7 != 0xffffffffffffffff) {
        frameCount = uVar8;
      }
      if (frameCount == 0) {
        mVar4 = MA_AT_END;
        goto LAB_00167638;
      }
    }
  }
  mVar4 = ma_data_source_read_pcm_frames_from_backend(pDataSource,pFramesOut,frameCount,&local_38);
LAB_00167638:
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = local_38;
  }
  mVar6 = MA_AT_END;
  if (local_38 != 0) {
    mVar6 = mVar4;
  }
  if (mVar4 != MA_SUCCESS) {
    mVar6 = mVar4;
  }
  return mVar6;
}

Assistant:

static ma_result ma_data_source_read_pcm_frames_within_range(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_uint64 framesRead = 0;
    ma_bool32 loop = ma_data_source_is_looping(pDataSource);

    if (pDataSourceBase == NULL) {
        return MA_AT_END;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    if ((pDataSourceBase->vtable->flags & MA_DATA_SOURCE_SELF_MANAGED_RANGE_AND_LOOP_POINT) != 0 || (pDataSourceBase->rangeEndInFrames == ~((ma_uint64)0) && (pDataSourceBase->loopEndInFrames == ~((ma_uint64)0) || loop == MA_FALSE))) {
        /* Either the data source is self-managing the range, or no range is set - just read like normal. The data source itself will tell us when the end is reached. */
        result = ma_data_source_read_pcm_frames_from_backend(pDataSource, pFramesOut, frameCount, &framesRead);
    } else {
        /* Need to clamp to within the range. */
        ma_uint64 relativeCursor;
        ma_uint64 absoluteCursor;

        result = ma_data_source_get_cursor_in_pcm_frames(pDataSourceBase, &relativeCursor);
        if (result != MA_SUCCESS) {
            /* Failed to retrieve the cursor. Cannot read within a range or loop points. Just read like normal - this may happen for things like noise data sources where it doesn't really matter. */
            result = ma_data_source_read_pcm_frames_from_backend(pDataSource, pFramesOut, frameCount, &framesRead);
        } else {
            ma_uint64 rangeBeg;
            ma_uint64 rangeEnd;

            /* We have the cursor. We need to make sure we don't read beyond our range. */
            rangeBeg = pDataSourceBase->rangeBegInFrames;
            rangeEnd = pDataSourceBase->rangeEndInFrames;

            absoluteCursor = rangeBeg + relativeCursor;

            /* If looping, make sure we're within range. */
            if (loop) {
                if (pDataSourceBase->loopEndInFrames != ~((ma_uint64)0)) {
                    rangeEnd = ma_min(rangeEnd, pDataSourceBase->rangeBegInFrames + pDataSourceBase->loopEndInFrames);
                }
            }

            if (frameCount > (rangeEnd - absoluteCursor) && rangeEnd != ~((ma_uint64)0)) {
                frameCount = (rangeEnd - absoluteCursor);
            }

            /*
            If the cursor is sitting on the end of the range the frame count will be set to 0 which can
            result in MA_INVALID_ARGS. In this case, we don't want to try reading, but instead return
            MA_AT_END so the higher level function can know about it.
            */
            if (frameCount > 0) {
                result = ma_data_source_read_pcm_frames_from_backend(pDataSource, pFramesOut, frameCount, &framesRead);
            } else {
                result = MA_AT_END; /* The cursor is sitting on the end of the range which means we're at the end. */
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = framesRead;
    }

    /* We need to make sure MA_AT_END is returned if we hit the end of the range. */
    if (result == MA_SUCCESS && framesRead == 0) {
        result  = MA_AT_END;
    }

    return result;
}